

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void gl4cts::GLSL420Pack::Utils::program::printShaderSource
               (shaderSource *source,MessageBuilder *log)

{
  ostringstream *this;
  char *pcVar1;
  pointer psVar2;
  ulong uVar3;
  ulong uVar4;
  char *__s;
  string line;
  char *local_68;
  long local_60;
  char local_58;
  undefined7 uStack_57;
  shaderSource *local_48;
  ulong local_40;
  ulong local_38;
  
  this = &log->m_str;
  std::__ostream_insert<char,std::char_traits<char>>
            (&this->super_basic_ostream<char,_std::char_traits<char>_>,"Shader source.",0xe);
  if ((source->m_parts).
      super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (source->m_parts).
      super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    local_48 = source;
    do {
      local_38 = uVar4;
      std::__ostream_insert<char,std::char_traits<char>>
                (&this->super_basic_ostream<char,_std::char_traits<char>_>,"\nLine||Part: ",0xd);
      uVar3 = local_38;
      local_40 = (ulong)((int)uVar4 + 1);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>
                (&this->super_basic_ostream<char,_std::char_traits<char>_>,"/",1);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      if (source->m_use_lengths == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this->super_basic_ostream<char,_std::char_traits<char>_>," Length: ",9);
        std::ostream::operator<<
                  (this,(source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar3].m_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&this->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
      psVar2 = (source->m_parts).
               super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __s = psVar2[uVar3].m_code._M_dataplus._M_p;
      if (__s != (char *)0x0) {
        do {
          local_60 = 0;
          local_58 = '\0';
          local_68 = &local_58;
          pcVar1 = strchr(__s,10);
          if (pcVar1 == (char *)0x0) {
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,(ulong)__s);
            pcVar1 = (char *)0x0;
          }
          else {
            pcVar1 = pcVar1 + 1;
            std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,(ulong)__s);
          }
          if (*__s != '\0') {
            *(undefined8 *)
             ((log->m_str).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
              [-3] + 0x10 +
             (long)&(log->m_str).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream) = 4;
            std::ostream::_M_insert<unsigned_long>((ulong)this);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&this->super_basic_ostream<char,_std::char_traits<char>_>,"||",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&this->super_basic_ostream<char,_std::char_traits<char>_>,local_68,local_60);
          }
          if (local_68 != &local_58) {
            operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
          }
          __s = pcVar1;
        } while (pcVar1 != (char *)0x0);
        psVar2 = (local_48->m_parts).
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        source = local_48;
      }
      uVar3 = ((long)(source->m_parts).
                     super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 3) *
              -0x3333333333333333;
      uVar4 = local_40;
    } while (local_40 <= uVar3 && uVar3 - local_40 != 0);
  }
  return;
}

Assistant:

void Utils::program::printShaderSource(const shaderSource& source, tcu::MessageBuilder& log)
{
	GLuint line_number = 0;

	log << "Shader source.";

	for (GLuint i = 0; i < source.m_parts.size(); ++i)
	{
		log << "\nLine||Part: " << (i + 1) << "/" << source.m_parts.size();

		if (true == source.m_use_lengths)
		{
			log << " Length: " << source.m_parts[i].m_length;
		}

		log << "\n";

		const GLchar* part = source.m_parts[i].m_code.c_str();

		while (0 != part)
		{
			std::string   line;
			const GLchar* next_line = strchr(part, '\n');

			if (0 != next_line)
			{
				next_line += 1;
				line.assign(part, next_line - part);
			}
			else
			{
				line = part;
			}

			if (0 != *part)
			{
				log << std::setw(4) << line_number << "||" << line;
			}

			part = next_line;
			line_number += 1;
		}
	}
}